

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_errmsg(sqlite3 *db)

{
  u32 uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (db == (sqlite3 *)0x0) {
    return "out of memory";
  }
  uVar1 = db->magic;
  if (((uVar1 != 0xa029a697) && (uVar1 != 0xf03b7906)) && (uVar1 != 0x4b771290)) {
    sqlite3_log(0x15,"API call with %s database connection pointer","invalid");
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x26561,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
    return "bad parameter or other API misuse";
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (db->mallocFailed != '\0') {
    pcVar4 = "out of memory";
    goto LAB_00126950;
  }
  if (db->errCode == 0) {
    uVar3 = 0;
LAB_00126a14:
    if ((0x1410004UL >> (uVar3 & 0x3f) & 1) == 0) {
      pcVar4 = (&sqlite3ErrStr_aMsg)[uVar3];
      goto LAB_00126950;
    }
  }
  else {
    pcVar4 = (char *)sqlite3ValueText(db->pErr,'\x01');
    if (pcVar4 != (char *)0x0) goto LAB_00126950;
    uVar2 = db->errCode;
    if (uVar2 == 0x204) {
      pcVar4 = "abort due to ROLLBACK";
      goto LAB_00126950;
    }
    if (uVar2 == 0x65) {
      pcVar4 = "no more rows available";
      goto LAB_00126950;
    }
    if (uVar2 == 100) {
      pcVar4 = "another row available";
      goto LAB_00126950;
    }
    uVar3 = (ulong)(uVar2 & 0xff);
    if ((uVar2 & 0xff) < 0x1d) goto LAB_00126a14;
  }
  pcVar4 = "unknown error";
LAB_00126950:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return pcVar4;
}

Assistant:

SQLITE_API const char *sqlite3_errmsg(sqlite3 *db){
  const char *z;
  if( !db ){
    return sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return sqlite3ErrStr(SQLITE_MISUSE_BKPT);
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }else{
    testcase( db->pErr==0 );
    z = db->errCode ? (char*)sqlite3_value_text(db->pErr) : 0;
    assert( !db->mallocFailed );
    if( z==0 ){
      z = sqlite3ErrStr(db->errCode);
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}